

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall
discordpp::Emoji::Emoji
          (Emoji *this,nullable_field<discordpp::Snowflake> *id,
          nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,omittable_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
                *roles,omittable_field<discordpp::User> *user,omittable_field<bool> *require_colons,
          omittable_field<bool> *managed,omittable_field<bool> *animated,
          omittable_field<bool> *available)

{
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var3;
  _Head_base<0UL,_bool_*,_false> _Var4;
  
  _Var1._M_head_impl =
       (id->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->id).super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    _Var3._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var3._M_head_impl = (Snowflake *)operator_new(8);
    (_Var3._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var3._M_head_impl;
  (this->id).super_field<discordpp::Snowflake>.s_ = (id->super_field<discordpp::Snowflake>).s_;
  (this->id)._vptr_nullable_field = (_func_int **)&PTR_operator__0024e3e8;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->name).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&name->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->name)._vptr_nullable_field = (_func_int **)&PTR_operator__0024e100;
  field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>::field
            (&(this->roles).
              super_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
             ,&roles->
               super_field<std::vector<discordpp::Snowflake,_std::allocator<discordpp::Snowflake>_>_>
            );
  (this->roles)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e570;
  field<discordpp::User>::field
            (&(this->user).super_field<discordpp::User>,&user->super_field<discordpp::User>);
  (this->user)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e5c0;
  _Var2._M_head_impl =
       (require_colons->super_field<bool>).t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    (this->require_colons).super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var4._M_head_impl = (bool *)0x0;
  }
  else {
    _Var4._M_head_impl = (bool *)operator_new(1);
    *_Var4._M_head_impl = *_Var2._M_head_impl;
  }
  (this->require_colons).super_field<bool>.t_._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var4._M_head_impl;
  (this->require_colons).super_field<bool>.s_ = (require_colons->super_field<bool>).s_;
  (this->require_colons)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  _Var2._M_head_impl =
       (managed->super_field<bool>).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
       _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    (this->managed).super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var4._M_head_impl = (bool *)0x0;
  }
  else {
    _Var4._M_head_impl = (bool *)operator_new(1);
    *_Var4._M_head_impl = *_Var2._M_head_impl;
  }
  (this->managed).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
  _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->managed).super_field<bool>.s_ = (managed->super_field<bool>).s_;
  (this->managed)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  _Var2._M_head_impl =
       (animated->super_field<bool>).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>
       ._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    (this->animated).super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var4._M_head_impl = (bool *)0x0;
  }
  else {
    _Var4._M_head_impl = (bool *)operator_new(1);
    *_Var4._M_head_impl = *_Var2._M_head_impl;
  }
  (this->animated).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>
  ._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->animated).super_field<bool>.s_ = (animated->super_field<bool>).s_;
  (this->animated)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  _Var2._M_head_impl =
       (available->super_field<bool>).t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    (this->available).super_field<bool>.t_._M_t.
    super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var4._M_head_impl = (bool *)0x0;
  }
  else {
    _Var4._M_head_impl = (bool *)operator_new(1);
    *_Var4._M_head_impl = *_Var2._M_head_impl;
  }
  (this->available).super_field<bool>.t_._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var4._M_head_impl;
  (this->available).super_field<bool>.s_ = (available->super_field<bool>).s_;
  (this->available)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e158;
  return;
}

Assistant:

Emoji(
        nullable_field<Snowflake> id = uninitialized,
        nullable_field<std::string> name = uninitialized,
        omittable_field<std::vector<Snowflake> > roles = omitted,
        omittable_field<User> user = omitted,
        omittable_field<bool> require_colons = omitted,
        omittable_field<bool> managed = omitted,
        omittable_field<bool> animated = omitted,
        omittable_field<bool> available = omitted
    ):
        id(id),
        name(name),
        roles(roles),
        user(user),
        require_colons(require_colons),
        managed(managed),
        animated(animated),
        available(available)
    {}